

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationSmokeTests.cpp
# Opt level: O0

TestStatus *
vkt::synchronization::anon_unknown_0::testSemaphores
          (TestStatus *__return_storage_ptr__,Context *context)

{
  GetPastPresentationTimingGOOGLEFunc *this;
  Vector<int,_2> *pVVar1;
  int iVar2;
  VkDevice pVVar3;
  RefData<vk::Handle<(vk::HandleType)4>_> data;
  deUint32 dVar4;
  VkResult VVar5;
  TestContext *this_00;
  TestLog *this_01;
  InstanceInterface *vki;
  VkPhysicalDevice physicalDevice_00;
  VkDevice_s **ppVVar6;
  VkQueue queue_00;
  VkQueue queue_01;
  ProgramCollection<vk::ProgramBinary> *pPVar7;
  int *piVar8;
  unsigned_long uVar9;
  MessageBuilder *pMVar10;
  Allocation *pAVar11;
  allocator<char> local_1469;
  string local_1468;
  TextureFormat local_1448;
  ConstPixelBufferAccess local_1440;
  allocator<char> local_1411;
  string local_1410;
  allocator<char> local_13e9;
  string local_13e8;
  LogImage local_13c8;
  deUint64 local_1338;
  allocator<char> local_1329;
  string local_1328;
  MessageBuilder local_1308;
  int local_1188;
  undefined4 uStack_1184;
  TextureFormat local_1180;
  ConstPixelBufferAccess local_1178;
  allocator<char> local_1149;
  string local_1148;
  allocator<char> local_1121;
  string local_1120;
  LogImage local_1100;
  deUint64 local_1070;
  undefined4 local_1068;
  allocator<char> local_1061;
  string local_1060;
  MessageBuilder local_1040;
  int local_ec0;
  undefined4 uStack_ebc;
  Vector<int,_2> local_eb8;
  Vector<int,_2> local_eb0;
  undefined1 local_ea8 [8];
  Vec4 vertices2 [3];
  Vec4 vertices1 [3];
  undefined1 local_e3c [8];
  VkPipelineStageFlags waitDstStageMask;
  void *resultImage;
  VkMappedMemoryRange range;
  VkSubmitInfo submitInfo [2];
  Move<vk::Handle<(vk::HandleType)4>_> local_d70;
  RefData<vk::Handle<(vk::HandleType)4>_> local_d50;
  undefined1 local_d30 [8];
  Unique<vk::Handle<(vk::HandleType)4>_> semaphore;
  TestContext testContext2;
  TestContext testContext1;
  VkResult testStatus;
  VkQueue queue [2];
  VkPhysicalDeviceMemoryProperties local_940;
  undefined1 local_738 [8];
  SimpleAllocator allocator;
  undefined1 local_508 [8];
  DeviceDriver deviceInterface;
  Move<vk::VkDevice_s_*> device;
  deUint32 queueFamilyIdx;
  VkPhysicalDevice physicalDevice;
  InstanceInterface *instanceInterface;
  TestLog *log;
  Context *context_local;
  
  this_00 = Context::getTestContext(context);
  this_01 = tcu::TestContext::getLog(this_00);
  vki = Context::getInstanceInterface(context);
  physicalDevice_00 = Context::getPhysicalDevice(context);
  this = &deviceInterface.m_vk.getPastPresentationTimingGOOGLE;
  createTestDevice((Move<vk::VkDevice_s_*> *)this,vki,physicalDevice_00,
                   (deUint32 *)
                   ((long)&device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator + 4));
  ppVVar6 = ::vk::refdetails::RefBase<vk::VkDevice_s_*>::operator*
                      ((RefBase<vk::VkDevice_s_*> *)this);
  ::vk::DeviceDriver::DeviceDriver((DeviceDriver *)local_508,vki,*ppVVar6);
  ppVVar6 = ::vk::refdetails::RefBase<vk::VkDevice_s_*>::operator*
                      ((RefBase<vk::VkDevice_s_*> *)
                       &deviceInterface.m_vk.getPastPresentationTimingGOOGLE);
  pVVar3 = *ppVVar6;
  ::vk::getPhysicalDeviceMemoryProperties(&local_940,vki,physicalDevice_00);
  ::vk::SimpleAllocator::SimpleAllocator
            ((SimpleAllocator *)local_738,(DeviceInterface *)local_508,pVVar3,&local_940);
  ppVVar6 = ::vk::refdetails::RefBase<vk::VkDevice_s_*>::operator*
                      ((RefBase<vk::VkDevice_s_*> *)
                       &deviceInterface.m_vk.getPastPresentationTimingGOOGLE);
  queue_00 = ::vk::getDeviceQueue
                       ((DeviceInterface *)local_508,*ppVVar6,
                        device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator._4_4_,0);
  ppVVar6 = ::vk::refdetails::RefBase<vk::VkDevice_s_*>::operator*
                      ((RefBase<vk::VkDevice_s_*> *)
                       &deviceInterface.m_vk.getPastPresentationTimingGOOGLE);
  queue_01 = ::vk::getDeviceQueue
                       ((DeviceInterface *)local_508,*ppVVar6,
                        device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator._4_4_,1);
  ppVVar6 = ::vk::refdetails::RefBase<vk::VkDevice_s_*>::get
                      ((RefBase<vk::VkDevice_s_*> *)
                       &deviceInterface.m_vk.getPastPresentationTimingGOOGLE);
  dVar4 = device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator._4_4_;
  pVVar3 = *ppVVar6;
  pPVar7 = Context::getBinaryCollection(context);
  TestContext::TestContext
            ((TestContext *)
             &testContext2.imageAllocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.field_0x8
             ,(DeviceInterface *)local_508,pVVar3,dVar4,pPVar7,(Allocator *)local_738);
  ppVVar6 = ::vk::refdetails::RefBase<vk::VkDevice_s_*>::get
                      ((RefBase<vk::VkDevice_s_*> *)
                       &deviceInterface.m_vk.getPastPresentationTimingGOOGLE);
  dVar4 = device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator._4_4_;
  pVVar3 = *ppVVar6;
  pPVar7 = Context::getBinaryCollection(context);
  TestContext::TestContext
            ((TestContext *)
             &semaphore.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_allocator,
             (DeviceInterface *)local_508,pVVar3,dVar4,pPVar7,(Allocator *)local_738);
  ppVVar6 = ::vk::refdetails::RefBase<vk::VkDevice_s_*>::operator*
                      ((RefBase<vk::VkDevice_s_*> *)
                       &deviceInterface.m_vk.getPastPresentationTimingGOOGLE);
  ::vk::createSemaphore
            (&local_d70,(DeviceInterface *)local_508,*ppVVar6,0,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_d50,(Move *)&local_d70);
  data.deleter.m_deviceIface = local_d50.deleter.m_deviceIface;
  data.object.m_internal = local_d50.object.m_internal;
  data.deleter.m_device = local_d50.deleter.m_device;
  data.deleter.m_allocator = local_d50.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)4>_> *)local_d30,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)4>_>::~Move(&local_d70);
  ::vk::VkMappedMemoryRange::VkMappedMemoryRange((VkMappedMemoryRange *)&resultImage);
  local_e3c._0_4_ = 1;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(vertices2[2].m_data + 2),0.5,0.5,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(vertices1[0].m_data + 2),-0.5,0.5,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(vertices1[1].m_data + 2),0.0,-0.5,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_ea8,-0.5,-0.5,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(vertices2[0].m_data + 2),0.5,-0.5,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(vertices2[1].m_data + 2),0.0,0.5,0.0,1.0);
  testContext1.allocator = (Allocator *)(vertices2[2].m_data + 2);
  testContext1.vertices._0_4_ = 3;
  tcu::Vector<int,_2>::Vector(&local_eb0,0x100,0x100);
  pVVar1 = (Vector<int,_2> *)((long)&testContext1.vertices + 4);
  testContext1._44_8_ = local_eb0.m_data;
  piVar8 = tcu::Vector<int,_2>::x(pVVar1);
  iVar2 = *piVar8;
  piVar8 = tcu::Vector<int,_2>::y(pVVar1);
  testContext1.fences[1].m_internal = (long)iVar2 * (long)*piVar8 * 4;
  testContext2.allocator = (Allocator *)local_ea8;
  testContext2.vertices._0_4_ = 3;
  tcu::Vector<int,_2>::Vector(&local_eb8,0x100,0x100);
  pVVar1 = (Vector<int,_2> *)((long)&testContext2.vertices + 4);
  testContext2._44_8_ = local_eb8.m_data;
  piVar8 = tcu::Vector<int,_2>::x(pVVar1);
  iVar2 = *piVar8;
  piVar8 = tcu::Vector<int,_2>::y(pVVar1);
  testContext2.fences[1].m_internal = (long)iVar2 * (long)*piVar8 * 4;
  ppVVar6 = ::vk::refdetails::RefBase<vk::VkDevice_s_*>::get
                      ((RefBase<vk::VkDevice_s_*> *)
                       &deviceInterface.m_vk.getPastPresentationTimingGOOGLE);
  createCommandBuffer((DeviceInterface *)local_508,*ppVVar6,
                      device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator._4_4_,
                      (Move<vk::VkCommandBuffer_s_*> *)
                      &testContext1.commandPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.
                       m_data.deleter.m_allocator,
                      (Move<vk::Handle<(vk::HandleType)24>_> *)
                      &testContext1.framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.
                       m_data.deleter.m_allocator);
  generateWork((TestContext *)
               &testContext2.imageAllocation.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                field_0x8);
  ppVVar6 = ::vk::refdetails::RefBase<vk::VkDevice_s_*>::get
                      ((RefBase<vk::VkDevice_s_*> *)
                       &deviceInterface.m_vk.getPastPresentationTimingGOOGLE);
  createCommandBuffer((DeviceInterface *)local_508,*ppVVar6,
                      device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator._4_4_,
                      (Move<vk::VkCommandBuffer_s_*> *)
                      &testContext2.commandPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.
                       m_data.deleter.m_allocator,
                      (Move<vk::Handle<(vk::HandleType)24>_> *)
                      &testContext2.framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.
                       m_data.deleter.m_allocator);
  generateWork((TestContext *)
               &semaphore.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_allocator);
  initSubmitInfo((VkSubmitInfo *)&range.size,2);
  submitInfo[0]._40_8_ =
       ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                 ((RefBase<vk::VkCommandBuffer_s_*> *)
                  &testContext1.commandPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.
                   deleter.m_allocator);
  submitInfo[1]._40_8_ =
       ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                 ((RefBase<vk::VkCommandBuffer_s_*> *)
                  &testContext2.commandPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.
                   deleter.m_allocator);
  submitInfo[0].pCommandBuffers._0_4_ = 1;
  submitInfo[0]._56_8_ =
       ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::get
                 ((RefBase<vk::Handle<(vk::HandleType)4>_> *)local_d30);
  submitInfo[1].pNext._0_4_ = 1;
  submitInfo[1]._16_8_ =
       ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::get
                 ((RefBase<vk::Handle<(vk::HandleType)4>_> *)local_d30);
  submitInfo[1].pWaitSemaphores = (VkSemaphore *)local_e3c;
  local_ec0 = testContext1.renderDimension.m_data[1];
  uStack_ebc = testContext1._60_4_;
  VVar5 = ::vk::DeviceDriver::queueSubmit
                    ((DeviceDriver *)local_508,queue_00,1,(VkSubmitInfo *)&range.size,
                     (VkFence)testContext1._56_8_);
  ::vk::checkResult(VVar5,
                    "deviceInterface.queueSubmit(queue[0], 1, &submitInfo[0], testContext1.fences[0])"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationSmokeTests.cpp"
                    ,0x494);
  ppVVar6 = ::vk::refdetails::RefBase<vk::VkDevice_s_*>::get
                      ((RefBase<vk::VkDevice_s_*> *)
                       &deviceInterface.m_vk.getPastPresentationTimingGOOGLE);
  pVVar3 = *ppVVar6;
  uVar9 = std::numeric_limits<unsigned_long>::max();
  testContext1.imageAllocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
  .m_data._12_4_ =
       ::vk::DeviceDriver::waitForFences
                 ((DeviceDriver *)local_508,pVVar3,1,
                  (VkFence *)(testContext1.renderDimension.m_data + 1),1,uVar9);
  if (testContext1.imageAllocation.
      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._12_4_ ==
      VK_SUCCESS) {
    resultImage._0_4_ = 6;
    range.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    range._4_4_ = 0;
    pAVar11 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                         &testContext1.renderSize);
    local_1070 = (deUint64)::vk::Allocation::getMemory(pAVar11);
    range.memory.m_internal = 0;
    range.offset = testContext1.fences[1].m_internal;
    range.pNext = (void *)local_1070;
    ppVVar6 = ::vk::refdetails::RefBase<vk::VkDevice_s_*>::get
                        ((RefBase<vk::VkDevice_s_*> *)
                         &deviceInterface.m_vk.getPastPresentationTimingGOOGLE);
    VVar5 = ::vk::DeviceDriver::invalidateMappedMemoryRanges
                      ((DeviceDriver *)local_508,*ppVVar6,1,(VkMappedMemoryRange *)&resultImage);
    ::vk::checkResult(VVar5,"deviceInterface.invalidateMappedMemoryRanges(device.get(), 1, &range)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationSmokeTests.cpp"
                      ,0x4a2);
    pAVar11 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                         &testContext1.renderSize);
    register0x00000000 = ::vk::Allocation::getHostPtr(pAVar11);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1120,"result",&local_1121);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1148,"result",&local_1149);
    tcu::TextureFormat::TextureFormat(&local_1180,RGBA,UNORM_INT8);
    pVVar1 = (Vector<int,_2> *)((long)&testContext1.vertices + 4);
    piVar8 = tcu::Vector<int,_2>::x(pVVar1);
    iVar2 = *piVar8;
    piVar8 = tcu::Vector<int,_2>::y(pVVar1);
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              (&local_1178,&local_1180,iVar2,*piVar8,1,stack0xfffffffffffff1c8);
    tcu::LogImage::LogImage
              (&local_1100,&local_1120,&local_1148,&local_1178,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::TestLog::operator<<(this_01,&local_1100);
    tcu::LogImage::~LogImage(&local_1100);
    std::__cxx11::string::~string((string *)&local_1148);
    std::allocator<char>::~allocator(&local_1149);
    std::__cxx11::string::~string((string *)&local_1120);
    std::allocator<char>::~allocator(&local_1121);
    local_1188 = testContext2.renderDimension.m_data[1];
    uStack_1184 = testContext2._60_4_;
    VVar5 = ::vk::DeviceDriver::queueSubmit
                      ((DeviceDriver *)local_508,queue_01,1,
                       (VkSubmitInfo *)&submitInfo[0].pSignalSemaphores,(VkFence)testContext2._56_8_
                      );
    ::vk::checkResult(VVar5,
                      "deviceInterface.queueSubmit(queue[1], 1, &submitInfo[1], testContext2.fences[0])"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationSmokeTests.cpp"
                      ,0x4ae);
    ppVVar6 = ::vk::refdetails::RefBase<vk::VkDevice_s_*>::get
                        ((RefBase<vk::VkDevice_s_*> *)
                         &deviceInterface.m_vk.getPastPresentationTimingGOOGLE);
    pVVar3 = *ppVVar6;
    uVar9 = std::numeric_limits<unsigned_long>::max();
    testContext1.imageAllocation.
    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._12_4_ =
         ::vk::DeviceDriver::waitForFences
                   ((DeviceDriver *)local_508,pVVar3,1,
                    (VkFence *)(testContext2.renderDimension.m_data + 1),1,uVar9);
    if (testContext1.imageAllocation.
        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._12_4_ ==
        VK_SUCCESS) {
      resultImage._0_4_ = 6;
      range.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      range._4_4_ = 0;
      pAVar11 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
                operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                           &testContext2.renderSize);
      local_1338 = (deUint64)::vk::Allocation::getMemory(pAVar11);
      range.memory.m_internal = 0;
      range.offset = testContext2.fences[1].m_internal;
      range.pNext = (void *)local_1338;
      ppVVar6 = ::vk::refdetails::RefBase<vk::VkDevice_s_*>::get
                          ((RefBase<vk::VkDevice_s_*> *)
                           &deviceInterface.m_vk.getPastPresentationTimingGOOGLE);
      VVar5 = ::vk::DeviceDriver::invalidateMappedMemoryRanges
                        ((DeviceDriver *)local_508,*ppVVar6,1,(VkMappedMemoryRange *)&resultImage);
      ::vk::checkResult(VVar5,
                        "deviceInterface.invalidateMappedMemoryRanges(device.get(), 1, &range)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationSmokeTests.cpp"
                        ,0x4bc);
      pAVar11 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
                operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                           &testContext2.renderSize);
      register0x00000000 = ::vk::Allocation::getHostPtr(pAVar11);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_13e8,"result",&local_13e9)
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1410,"result",&local_1411)
      ;
      tcu::TextureFormat::TextureFormat(&local_1448,RGBA,UNORM_INT8);
      pVVar1 = (Vector<int,_2> *)((long)&testContext2.vertices + 4);
      piVar8 = tcu::Vector<int,_2>::x(pVVar1);
      iVar2 = *piVar8;
      piVar8 = tcu::Vector<int,_2>::y(pVVar1);
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                (&local_1440,&local_1448,iVar2,*piVar8,1,stack0xfffffffffffff1c8);
      tcu::LogImage::LogImage
                (&local_13c8,&local_13e8,&local_1410,&local_1440,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::TestLog::operator<<(this_01,&local_13c8);
      tcu::LogImage::~LogImage(&local_13c8);
      std::__cxx11::string::~string((string *)&local_1410);
      std::allocator<char>::~allocator(&local_1411);
      std::__cxx11::string::~string((string *)&local_13e8);
      std::allocator<char>::~allocator(&local_13e9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1468,"synchronization-semaphores passed",&local_1469);
      tcu::TestStatus::pass(__return_storage_ptr__,&local_1468);
      std::__cxx11::string::~string((string *)&local_1468);
      std::allocator<char>::~allocator(&local_1469);
    }
    else {
      tcu::TestLog::operator<<(&local_1308,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar10 = tcu::MessageBuilder::operator<<
                          (&local_1308,
                           (char (*) [51])"testSynchPrimitives failed to wait for a set fence");
      tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1308);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1328,"failed to wait for a set fence",&local_1329);
      tcu::TestStatus::fail(__return_storage_ptr__,&local_1328);
      std::__cxx11::string::~string((string *)&local_1328);
      std::allocator<char>::~allocator(&local_1329);
    }
  }
  else {
    tcu::TestLog::operator<<(&local_1040,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar10 = tcu::MessageBuilder::operator<<
                        (&local_1040,
                         (char (*) [51])"testSynchPrimitives failed to wait for a set fence");
    tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1040);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1060,"failed to wait for a set fence",&local_1061);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_1060);
    std::__cxx11::string::~string((string *)&local_1060);
    std::allocator<char>::~allocator(&local_1061);
  }
  local_1068 = 1;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)4>_> *)local_d30);
  TestContext::~TestContext
            ((TestContext *)
             &semaphore.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_allocator);
  TestContext::~TestContext
            ((TestContext *)
             &testContext2.imageAllocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.field_0x8
            );
  ::vk::SimpleAllocator::~SimpleAllocator((SimpleAllocator *)local_738);
  ::vk::DeviceDriver::~DeviceDriver((DeviceDriver *)local_508);
  ::vk::refdetails::Move<vk::VkDevice_s_*>::~Move
            ((Move<vk::VkDevice_s_*> *)&deviceInterface.m_vk.getPastPresentationTimingGOOGLE);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus testSemaphores (Context& context)
{
	TestLog&					log					= context.getTestContext().getLog();
	const InstanceInterface&	instanceInterface	= context.getInstanceInterface();
	const VkPhysicalDevice		physicalDevice		= context.getPhysicalDevice();
	deUint32					queueFamilyIdx;
	vk::Move<VkDevice>			device				= createTestDevice(instanceInterface, physicalDevice, &queueFamilyIdx);
	const DeviceDriver			deviceInterface		(instanceInterface, *device);
	SimpleAllocator				allocator			(deviceInterface,
													 *device,
													 getPhysicalDeviceMemoryProperties(instanceInterface, physicalDevice));
	const VkQueue				queue[2]			=
	{
		getDeviceQueue(deviceInterface, *device, queueFamilyIdx, 0),
		getDeviceQueue(deviceInterface, *device, queueFamilyIdx, 1)
	};
	VkResult					testStatus;
	TestContext					testContext1		(deviceInterface, device.get(), queueFamilyIdx, context.getBinaryCollection(), allocator);
	TestContext					testContext2		(deviceInterface, device.get(), queueFamilyIdx, context.getBinaryCollection(), allocator);
	Unique<VkSemaphore>			semaphore			(createSemaphore(deviceInterface, *device));
	VkSubmitInfo				submitInfo[2];
	VkMappedMemoryRange			range;
	void*						resultImage;
	const VkPipelineStageFlags	waitDstStageMask	= VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT;

	const tcu::Vec4		vertices1[]			=
	{
		tcu::Vec4( 0.5f,  0.5f, 0.0f, 1.0f),
		tcu::Vec4(-0.5f,  0.5f, 0.0f, 1.0f),
		tcu::Vec4( 0.0f, -0.5f, 0.0f, 1.0f)
	};

	const tcu::Vec4		vertices2[]			=
	{
		tcu::Vec4(-0.5f, -0.5f, 0.0f, 1.0f),
		tcu::Vec4(+0.5f, -0.5f, 0.0f, 1.0f),
		tcu::Vec4( 0.0f, +0.5f, 0.0f, 1.0f)
	};

	testContext1.vertices			= vertices1;
	testContext1.numVertices		= DE_LENGTH_OF_ARRAY(vertices1);
	testContext1.renderDimension	= tcu::IVec2(256, 256);
	testContext1.renderSize			= sizeof(deUint32) * testContext1.renderDimension.x() * testContext1.renderDimension.y();

	testContext2.vertices			= vertices2;
	testContext2.numVertices		= DE_LENGTH_OF_ARRAY(vertices2);
	testContext2.renderDimension	= tcu::IVec2(256, 256);
	testContext2.renderSize			= sizeof(deUint32) * testContext2.renderDimension.x() * testContext2.renderDimension.y();

	createCommandBuffer(deviceInterface, device.get(), queueFamilyIdx, &testContext1.cmdBuffer, &testContext1.commandPool);
	generateWork(testContext1);

	createCommandBuffer(deviceInterface, device.get(), queueFamilyIdx, &testContext2.cmdBuffer, &testContext2.commandPool);
	generateWork(testContext2);

	initSubmitInfo(submitInfo, DE_LENGTH_OF_ARRAY(submitInfo));

	// The difference between the two submit infos is that each will use a unique cmd buffer,
	// and one will signal a semaphore but not wait on a semaphore, the other will wait on the
	// semaphore but not signal a semaphore
	submitInfo[0].pCommandBuffers		= &testContext1.cmdBuffer.get();
	submitInfo[1].pCommandBuffers		= &testContext2.cmdBuffer.get();

	submitInfo[0].signalSemaphoreCount	= 1;
	submitInfo[0].pSignalSemaphores		= &semaphore.get();
	submitInfo[1].waitSemaphoreCount	= 1;
	submitInfo[1].pWaitSemaphores		= &semaphore.get();
	submitInfo[1].pWaitDstStageMask		= &waitDstStageMask;

	VK_CHECK(deviceInterface.queueSubmit(queue[0], 1, &submitInfo[0], testContext1.fences[0]));

	testStatus  = deviceInterface.waitForFences(device.get(), 1, &testContext1.fences[0], true, std::numeric_limits<deUint64>::max());
	if (testStatus != VK_SUCCESS)
	{
		log << TestLog::Message << "testSynchPrimitives failed to wait for a set fence" << TestLog::EndMessage;
		return tcu::TestStatus::fail("failed to wait for a set fence");
	}

	range.sType			= VK_STRUCTURE_TYPE_MAPPED_MEMORY_RANGE;
	range.pNext			= DE_NULL;
	range.memory		= testContext1.renderReadBuffer->getMemory();
	range.offset		= 0;
	range.size			= testContext1.renderSize;
	VK_CHECK(deviceInterface.invalidateMappedMemoryRanges(device.get(), 1, &range));
	resultImage = testContext1.renderReadBuffer->getHostPtr();

	log << TestLog::Image(	"result",
							"result",
							tcu::ConstPixelBufferAccess(tcu::TextureFormat(
									tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8),
									testContext1.renderDimension.x(),
									testContext1.renderDimension.y(),
									1,
									resultImage));

	VK_CHECK(deviceInterface.queueSubmit(queue[1], 1, &submitInfo[1], testContext2.fences[0]));

	testStatus  = deviceInterface.waitForFences(device.get(), 1, &testContext2.fences[0], true, std::numeric_limits<deUint64>::max());
	if (testStatus != VK_SUCCESS)
	{
		log << TestLog::Message << "testSynchPrimitives failed to wait for a set fence" << TestLog::EndMessage;
		return tcu::TestStatus::fail("failed to wait for a set fence");
	}

	range.sType			= VK_STRUCTURE_TYPE_MAPPED_MEMORY_RANGE;
	range.pNext			= DE_NULL;
	range.memory		= testContext2.renderReadBuffer->getMemory();
	range.offset		= 0;
	range.size			= testContext2.renderSize;
	VK_CHECK(deviceInterface.invalidateMappedMemoryRanges(device.get(), 1, &range));
	resultImage = testContext2.renderReadBuffer->getHostPtr();

	log << TestLog::Image(	"result",
							"result",
							tcu::ConstPixelBufferAccess(tcu::TextureFormat(
									tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8),
									testContext2.renderDimension.x(),
									testContext2.renderDimension.y(),
									1,
									resultImage));

	return tcu::TestStatus::pass("synchronization-semaphores passed");
}